

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_impl_avx2.c
# Opt level: O3

uint aom_sad128x64_avx2(uint8_t *src_ptr,int src_stride,uint8_t *ref_ptr,int ref_stride)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = sad64x64(src_ptr,src_stride,ref_ptr,ref_stride);
  uVar2 = sad64x64(src_ptr + 0x40,src_stride,ref_ptr + 0x40,ref_stride);
  return uVar2 + uVar1;
}

Assistant:

unsigned int aom_sad128x64_avx2(const uint8_t *src_ptr, int src_stride,
                                const uint8_t *ref_ptr, int ref_stride) {
  unsigned int half_width = 64;
  uint32_t sum = sad64x64(src_ptr, src_stride, ref_ptr, ref_stride);
  src_ptr += half_width;
  ref_ptr += half_width;
  sum += sad64x64(src_ptr, src_stride, ref_ptr, ref_stride);
  return sum;
}